

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zigzag_persistence.h
# Opt level: O3

void __thiscall
Gudhi::zigzag_persistence::Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options>::
Zigzag_persistence(Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options> *this,
                  function<void_(int,_int,_int)> *stream_interval,uint preallocationSize)

{
  undefined8 uVar1;
  Column_settings *colSettings;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:267:13)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:267:13)>
             ::_M_manager;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:273:13)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:273:13)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  local_38._M_unused._M_object = this;
  colSettings = (Column_settings *)operator_new(0x38);
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.ptr = (char *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.sz = 0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  (this->matrix_).colSettings_ = colSettings;
  persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>>>
              *)&(this->matrix_).matrix_,preallocationSize,colSettings,
             (function<bool_(unsigned_int,_unsigned_int)> *)&local_38,
             (function<bool_(unsigned_int,_unsigned_int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  (this->births_)._M_h._M_buckets = &(this->births_)._M_h._M_single_bucket;
  (this->births_)._M_h._M_bucket_count = 1;
  (this->births_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->births_)._M_h._M_element_count = 0;
  (this->births_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->births_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->births_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->birthOrdering_).birthToPos_._M_h._M_rehash_policy = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_buckets =
       &(this->birthOrdering_).birthToPos_._M_h._M_single_bucket;
  (this->birthOrdering_).birthToPos_._M_h._M_bucket_count = 1;
  (this->birthOrdering_).birthToPos_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->birthOrdering_).birthToPos_._M_h._M_element_count = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->birthOrdering_).birthToPos_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->birthOrdering_).maxBirthPos_ = 0;
  *(undefined8 *)&(this->birthOrdering_).minBirthPos_ = 0xffffffffffffffff;
  *(undefined8 *)&(this->stream_interval_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->stream_interval_).super__Function_base._M_functor + 8) = 0;
  (this->stream_interval_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->stream_interval_)._M_invoker = stream_interval->_M_invoker;
  if ((stream_interval->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(stream_interval->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->stream_interval_).super__Function_base._M_functor =
         *(undefined8 *)&(stream_interval->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->stream_interval_).super__Function_base._M_functor + 8) = uVar1;
    (this->stream_interval_).super__Function_base._M_manager =
         (stream_interval->super__Function_base)._M_manager;
    (stream_interval->super__Function_base)._M_manager = (_Manager_type)0x0;
    stream_interval->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

Zigzag_persistence(std::function<void(Dimension, Index, Index)> stream_interval,
                     unsigned int preallocationSize = 0)
      : matrix_(
            preallocationSize,
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool {
              if (matrix_.get_column(columnIndex1).is_paired()) {
                return matrix_.get_pivot(columnIndex1) < matrix_.get_pivot(columnIndex2);
              }
              return birthOrdering_.birth_order(births_.at(columnIndex1), births_.at(columnIndex2));
            },
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool { return false; }),
        numArrow_(-1),
        stream_interval_(std::move(stream_interval)) {}